

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cc
# Opt level: O0

void __thiscall
sentencepiece::filesystem::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string_view filename,bool is_binary)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  const_pointer pvVar4;
  StatusBuilder *this_00;
  byte in_CL;
  _Ios_Openmode _Var5;
  WritableFile *in_RDI;
  int in_stack_0000037c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  StatusBuilder *in_stack_fffffffffffffdc0;
  _func_int **local_210;
  WritableFile *s;
  StatusBuilder *this_01;
  string local_1f0 [32];
  const_pointer local_1d0;
  undefined1 local_39;
  _func_int **local_38;
  byte local_19;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_19 = in_CL & 1;
  WritableFile::WritableFile(in_RDI);
  in_RDI->_vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_006f13f8;
  this_01 = (StatusBuilder *)(in_RDI + 1);
  util::Status::Status((Status *)0x46a84d);
  s = in_RDI + 2;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  local_39 = 0;
  if (bVar1) {
    local_210 = (_func_int **)&std::cout;
  }
  else {
    local_210 = (_func_int **)operator_new(0x200);
    local_39 = 1;
    local_38 = local_210;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    bVar2 = local_19;
    _Var3 = std::operator|(_S_bin,_S_out);
    _Var5 = _S_out;
    if ((bVar2 & 1) != 0) {
      _Var5 = _Var3;
    }
    std::ofstream::ofstream(local_210,pvVar4,_Var5);
  }
  s->_vptr_WritableFile = local_210;
  bVar2 = std::ios::operator!((ios *)((long)in_RDI[2]._vptr_WritableFile +
                                     *(long *)(*in_RDI[2]._vptr_WritableFile + -0x18)));
  if ((bVar2 & 1) != 0) {
    util::StatusBuilder::StatusBuilder
              (in_stack_fffffffffffffdc0,(StatusCode)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
               (int)in_stack_fffffffffffffdb8);
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffdc0,(char (*) [2])in_stack_fffffffffffffdb8);
    local_1d0 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    util::StatusBuilder::operator<<(in_stack_fffffffffffffdc0,(char **)in_stack_fffffffffffffdb8);
    this_00 = util::StatusBuilder::operator<<
                        (in_stack_fffffffffffffdc0,(char (*) [4])in_stack_fffffffffffffdb8);
    __errno_location();
    util::StrError_abi_cxx11_(in_stack_0000037c);
    util::StatusBuilder::operator<<(this_00,in_stack_fffffffffffffdb8);
    util::StatusBuilder::operator_cast_to_Status(this_01);
    util::Status::operator=((Status *)in_RDI,(Status *)s);
    util::Status::~Status((Status *)0x46aa13);
    std::__cxx11::string::~string(local_1f0);
    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x46aa2a);
  }
  return;
}

Assistant:

PosixWritableFile(absl::string_view filename, bool is_binary = false)
      : os_(filename.empty()
                ? &std::cout
                : new std::ofstream(WPATH(filename),
                                    is_binary ? std::ios::binary | std::ios::out
                                              : std::ios::out)) {
    if (!*os_)
      status_ =
          util::StatusBuilder(util::StatusCode::kPermissionDenied, GTL_LOC)
          << "\"" << filename.data() << "\": " << util::StrError(errno);
  }